

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O0

void init_conspage(conspage *base,uint link)

{
  uint *puVar1;
  uint local_24;
  int j;
  ConsCell *cell;
  uint link_local;
  conspage *base_local;
  
  local_24 = 0xfe;
  *(uint *)&base->field_0x8 = *(uint *)&base->field_0x8 & 0xff00ffff | 0xf80000;
  while (8 < (int)local_24) {
    puVar1 = (uint *)((long)&base->cell6 + (long)(int)(local_24 ^ 6) * 2);
    *puVar1 = *puVar1 & 0xf0000000;
    local_24 = local_24 - 2;
    *puVar1 = *puVar1 & 0xffffff | (local_24 ^ 6) << 0x18;
  }
  puVar1 = (uint *)((long)&base->cell6 + (long)(int)(local_24 ^ 6) * 2);
  *puVar1 = *puVar1 & 0xf0000000;
  *puVar1 = *puVar1 & 0xffffff;
  *(uint *)&base->field_0x8 = *(uint *)&base->field_0x8 & 0xffffff | 0x7c000000;
  base->next_page = link;
  return;
}

Assistant:

static void init_conspage(struct conspage *base, unsigned int link)
{
  ConsCell *cell;
  int j; /* DL-> int */

#ifdef TRACE2
  printf("TRACE: init_conspage()\n");
#endif

#ifdef NEWCDRCODING
  j = 254;
  base->next_cell = 6 ^ j;
  while (j > 8) {
    cell = (ConsCell *)((DLword *)base + (6 ^ j));
    cell->car_field = NIL_PTR;
    j -= 2;
    ((freecons *)cell)->next_free = (6 ^ j);
  }
  cell = (ConsCell *)((DLword *)base + (6 ^ j));
  cell->car_field = NIL_PTR;
  ((freecons *)cell)->next_free = 0;
  base->count = 124;
#else
  base->next_cell = j = 254;
  while (j != 0) {
    cell = (ConsCell *)((DLword *)base + j);
    cell->car_field = NIL_PTR;
    j -= 2;
    ((freecons *)cell)->next_free = j;
  }
  cell = (ConsCell *)((DLword *)base + j);
  cell->car_field = NIL_PTR;
  ((freecons *)cell)->next_free = 0;
  base->count = 127;
#endif /* NEWCDRCODING */
  base->next_page = link;

}